

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

void tmiss(obj *obj,monst *mon)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = mshot_xname(obj);
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_0017fb70;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017fb15;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017fb0c;
    }
    else {
LAB_0017fb0c:
      if (ublindf == (obj *)0x0) goto LAB_0017fbd9;
LAB_0017fb15:
      if (ublindf->oartifact != '\x1d') goto LAB_0017fbd9;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mon->my][mon->mx] & 1U) != 0)) &&
       ((mon->data->mflags3 & 0x200) != 0)) goto LAB_0017fb70;
  }
  else {
    bVar1 = worm_known(level,mon);
    if (bVar1 != '\0') {
LAB_0017fb70:
      uVar2 = *(uint *)&mon->field_0x60;
      if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar2 & 0x280) == 0) goto LAB_0017fbb6;
      }
      else if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0017fbb6:
        if (((u._1052_1_ & 0x20) == 0) && ((mon->m_ap_type == '\0' || (mon->m_ap_type == '\x03'))))
        {
          miss(pcVar3,mon);
          goto LAB_0017fc07;
        }
      }
    }
  }
LAB_0017fbd9:
  pcVar3 = The(pcVar3);
  pcVar4 = otense(obj,"miss");
  pline("%s %s.",pcVar3,pcVar4);
LAB_0017fc07:
  uVar2 = mt_random();
  if (uVar2 % 3 == 0) {
    wakeup(mon);
    return;
  }
  return;
}

Assistant:

static void tmiss(struct obj *obj, struct monst *mon)
{
    const char *missile = mshot_xname(obj);

    /* If the target can't be seen or doesn't look like a valid target,
       avoid "the arrow misses it," or worse, "the arrows misses the mimic."
       An attentive player will still notice that this is different from
       an arrow just landing short of any target (no message in that case),
       so will realize that there is a valid target here anyway. */
    if (!canseemon(level, mon) || (mon->m_ap_type && mon->m_ap_type != M_AP_MONSTER))
	pline("%s %s.", The(missile), otense(obj, "miss"));
    else
	miss(missile, mon);
    if (!rn2(3)) wakeup(mon);
    return;
}